

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

CBString * hashTypeToUString(CBString *__return_storage_ptr__,UINT16 algorithm_id)

{
  undefined6 in_register_00000032;
  char *s;
  
  switch((int)CONCAT62(in_register_00000032,algorithm_id)) {
  case 4:
    s = "SHA1";
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %04Xh",algorithm_id);
    return __return_storage_ptr__;
  case 0xb:
    s = "SHA256";
    break;
  case 0xc:
    s = "SHA384";
    break;
  case 0xd:
    s = "SHA512";
    break;
  case 0x10:
    s = "NULL";
    break;
  case 0x12:
    s = "SM3";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString hashTypeToUString(const UINT16 algorithm_id)
{
    switch (algorithm_id) {
        case TCG_HASH_ALGORITHM_ID_SHA1:   return UString("SHA1");
        case TCG_HASH_ALGORITHM_ID_SHA256: return UString("SHA256");
        case TCG_HASH_ALGORITHM_ID_SHA384: return UString("SHA384");
        case TCG_HASH_ALGORITHM_ID_SHA512: return UString("SHA512");
        case TCG_HASH_ALGORITHM_ID_NULL:   return UString("NULL");
        case TCG_HASH_ALGORITHM_ID_SM3:    return UString("SM3");
    }
    
    return usprintf("Unknown %04Xh", algorithm_id);
}